

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

int Vec_QueMoveUp(Vec_Que_t *p,int v)

{
  int iVar1;
  float *pfVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  pfVar2 = *p->pCostsFlt;
  if (pfVar2 == (float *)0x0) {
    fVar8 = (float)v;
  }
  else {
    fVar8 = pfVar2[v];
  }
  piVar3 = p->pOrder;
  uVar7 = (ulong)piVar3[v];
  if (uVar7 == 0xffffffffffffffff) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  piVar4 = p->pHeap;
  if (piVar4[uVar7] != v) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  iVar5 = 0;
  while (iVar6 = (int)uVar7, 1 < iVar6) {
    iVar1 = piVar4[(uint)(iVar6 >> 1)];
    if (pfVar2 == (float *)0x0) {
      fVar9 = (float)iVar1;
    }
    else {
      fVar9 = pfVar2[iVar1];
    }
    if (fVar8 <= fVar9) break;
    piVar4[uVar7 & 0xffffffff] = iVar1;
    piVar3[iVar1] = iVar6;
    iVar5 = 1;
    uVar7 = (ulong)(uint)(iVar6 >> 1);
  }
  piVar4[iVar6] = v;
  piVar3[v] = iVar6;
  return iVar5;
}

Assistant:

static inline int Vec_QueMoveUp( Vec_Que_t * p, int v )
{
    float Cost = Vec_QuePrio(p, v);
    int i      = p->pOrder[v];
    int parent = i >> 1;
    int fMoved = 0;
    assert( p->pOrder[v] != -1 );
    assert( p->pHeap[i] == v );
    while ( i > 1 && Cost > Vec_QuePrio(p, p->pHeap[parent]) )
    {
        p->pHeap[i]            = p->pHeap[parent];
        p->pOrder[p->pHeap[i]] = i;
        i                      = parent;
        parent                 = i >> 1;
        fMoved                 = 1;
    }
    p->pHeap[i]  = v;
    p->pOrder[v] = i;
    return fMoved;
}